

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_large_dalloc_stats_update(tsdn_t *tsdn,arena_t *arena,size_t usize)

{
  void ***pppvVar1;
  szind_t sVar2;
  ulong uVar3;
  arena_t *size;
  
  size = (arena_t *)0x4000;
  if ((arena_t *)0x4000 < arena) {
    size = arena;
  }
  sVar2 = sz_size2index_compute((size_t)size);
  uVar3 = 0;
  if (0x23 < sVar2) {
    uVar3 = (ulong)(sVar2 - 0x24);
  }
  LOCK();
  pppvVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_small
              [uVar3 * 2 + 10].avail;
  *pppvVar1 = (void **)((long)*pppvVar1 + 1);
  UNLOCK();
  return;
}

Assistant:

static void
arena_large_dalloc_stats_update(tsdn_t *tsdn, arena_t *arena, size_t usize) {
	szind_t index, hindex;

	cassert(config_stats);

	if (usize < SC_LARGE_MINCLASS) {
		usize = SC_LARGE_MINCLASS;
	}
	index = sz_size2index(usize);
	hindex = (index >= SC_NBINS) ? index - SC_NBINS : 0;

	arena_stats_add_u64(tsdn, &arena->stats,
	    &arena->stats.lstats[hindex].ndalloc, 1);
}